

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Poly.cpp
# Opt level: O3

void __thiscall chrono::ChFunction_Poly::ArchiveIN(ChFunction_Poly *this,ChArchiveIn *marchive)

{
  ChNameValue<double[6]> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Poly>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_38._value = &this->coeff;
  local_38._name = "coeff";
  local_38._flags = '\0';
  ChArchiveIn::in<double,6ul>(marchive,&local_38);
  local_38._value = (double (*) [6])&this->order;
  local_38._name = "order";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x18))(marchive,&local_38);
  return;
}

Assistant:

void ChFunction_Poly::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Poly>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(coeff);
    marchive >> CHNVP(order);
}